

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,bool linking)

{
  _Rb_tree_header *p_Var1;
  pointer *ppcVar2;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  iterator __position;
  bool bVar3;
  TargetType TVar4;
  undefined8 in_RAX;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  cmGraphEdge local_28;
  
  local_28._4_4_ = SUB84((ulong)in_RAX >> 0x20,0);
  bVar3 = cmGeneratorTarget::IsImported(dependee);
  if ((bVar3) || (TVar4 = cmGeneratorTarget::GetType(dependee), TVar4 == INTERFACE_LIBRARY)) {
    psVar5 = cmGeneratorTarget::GetUtilityItems(dependee);
    for (p_Var6 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if (*(cmGeneratorTarget **)(p_Var6 + 2) != (cmGeneratorTarget *)0x0) {
        AddTargetDepend(this,depender_index,*(cmGeneratorTarget **)(p_Var6 + 2),false);
      }
    }
    return;
  }
  p_Var8 = (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 != (_Base_ptr)0x0) {
    p_Var1 = &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(cmGeneratorTarget **)(p_Var8 + 1) >= dependee) {
        p_Var7 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(cmGeneratorTarget **)(p_Var8 + 1) < dependee];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(cmGeneratorTarget **)(p_Var7 + 1) <= dependee))
    {
      this_00 = &(this->InitialGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_start[depender_index].
                 super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      local_28.Strong = !linking;
      local_28.Dest = *(int *)&p_Var7[1]._M_parent;
      __position._M_current =
           (this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = local_28;
        ppcVar2 = &(this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar2 = *ppcVar2 + 1;
        return;
      }
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
                (this_00,__position,&local_28);
      return;
    }
  }
  __assert_fail("tii != this->TargetIndex.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmComputeTargetDepends.cxx"
                ,0x17b,
                "void cmComputeTargetDepends::AddTargetDepend(int, const cmGeneratorTarget *, bool)"
               );
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(int depender_index,
                                             const cmGeneratorTarget* dependee,
                                             bool linking)
{
  if (dependee->IsImported() ||
      dependee->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    // Skip IMPORTED and INTERFACE targets but follow their utility
    // dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for (std::set<cmLinkItem>::const_iterator i = utils.begin();
         i != utils.end(); ++i) {
      if (cmGeneratorTarget const* transitive_dependee = i->Target) {
        this->AddTargetDepend(depender_index, transitive_dependee, false);
      }
    }
  } else {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    std::map<cmGeneratorTarget const*, int>::const_iterator tii =
      this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].push_back(
      cmGraphEdge(dependee_index, !linking));
  }
}